

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreModule.c
# Opt level: O1

cs_err XCore_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  XCore_init(MRI);
  ud->printer = XCore_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->disasm = XCore_getInstruction;
  ud->post_printer = XCore_post_printer;
  ud->reg_name = XCore_reg_name;
  ud->insn_id = XCore_get_insn_id;
  ud->insn_name = XCore_insn_name;
  ud->group_name = XCore_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err XCore_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	XCore_init(mri);
	ud->printer = XCore_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = XCore_getInstruction;
	ud->post_printer = XCore_post_printer;

	ud->reg_name = XCore_reg_name;
	ud->insn_id = XCore_get_insn_id;
	ud->insn_name = XCore_insn_name;
	ud->group_name = XCore_group_name;

	return CS_ERR_OK;
}